

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

basic_message<wchar_t> *
booster::locale::dpgettext<wchar_t>(char *domain,wchar_t *context,wchar_t *id,locale *loc)

{
  char *in_RSI;
  basic_message<wchar_t> *in_RDI;
  char_type_conflict *in_stack_ffffffffffffff08;
  basic_message<wchar_t> *in_stack_ffffffffffffff10;
  string *domain_id;
  locale *in_stack_ffffffffffffff20;
  basic_message<wchar_t> *in_stack_ffffffffffffff28;
  undefined1 local_c9 [185];
  char *local_10;
  
  local_10 = in_RSI;
  basic_message<wchar_t>::basic_message
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,&in_RDI->n_);
  domain_id = (string *)local_c9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_c9 + 1),local_10,(allocator *)domain_id);
  basic_message<wchar_t>::str(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,domain_id);
  std::__cxx11::string::~string((string *)(local_c9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_c9);
  basic_message<wchar_t>::~basic_message(in_RDI);
  return in_RDI;
}

Assistant:

std::basic_string<CharType>  dpgettext( char const *domain,
                                                CharType const *context,
                                                CharType const *id,
                                                std::locale const &loc=std::locale())
        {
            return basic_message<CharType>(context,id).str(loc,domain);
        }